

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringClass.cpp
# Opt level: O2

char * dirname(char *__path)

{
  uint uVar1;
  String *in_RSI;
  char *data;
  
  uVar1 = String::lastIndexOf(in_RSI,"/",-1);
  if ((int)uVar1 < 1) {
    if (*(in_RSI->_string)._M_dataplus._M_p == '/') {
      data = "/";
    }
    else {
      data = "";
    }
    String::String((String *)__path,data);
  }
  else {
    String::mid((String *)__path,in_RSI,0,(ulong)uVar1);
  }
  return __path;
}

Assistant:

String dirname (String const& path)
{
	int lastpos = path.lastIndexOf (DIRSLASH);

	if (lastpos > 0)
		return path.mid (0, lastpos);

#ifndef _WIN32
	if (path[0] == '/')
		return "/";
#endif // _WIN32

	return "";
}